

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<char> * __thiscall
VW::config::typed_option<char>::value(typed_option<char> *this,char value)

{
  typed_option<char> *in_RDI;
  char *in_stack_00000008;
  shared_ptr<char> *in_stack_ffffffffffffffe0;
  
  std::make_shared<char,char&>(in_stack_00000008);
  std::shared_ptr<char>::operator=(in_stack_ffffffffffffffe0,(shared_ptr<char> *)in_RDI);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)0x357e27);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }